

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnumMethods.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::builtins::EnumFirstLastMethod::eval
          (EnumFirstLastMethod *this,EvalContext *context,Args *args,SourceRange param_4,
          SystemCallInfo *param_5)

{
  SourceRange referencingRange;
  bool bVar1;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RCX;
  long in_RSI;
  Type *in_RDI;
  self_type prev;
  specific_symbol_iterator<slang::ast::EnumValueSymbol> it;
  EnumValueSymbol *value;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_(std::ranges::subrange_kind)0>
  range;
  EnumType *type;
  specific_symbol_iterator<slang::ast::EnumValueSymbol> *in_stack_ffffffffffffff48;
  Type *this_00;
  Expression *in_stack_ffffffffffffff88;
  EvalContext *in_stack_ffffffffffffff90;
  SystemSubroutine *in_stack_ffffffffffffff98;
  EnumValueSymbol *local_60;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_(std::ranges::subrange_kind)0>
  local_48;
  EnumType *local_38;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *local_30;
  
  this_00 = in_RDI;
  local_30 = in_RCX;
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,0);
  bVar1 = SystemSubroutine::noHierarchical
                    (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (bVar1) {
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](local_30,0);
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x13444ad);
    Type::getCanonicalType(in_RDI);
    local_38 = Symbol::as<slang::ast::EnumType>((Symbol *)0x13444bd);
    local_48 = EnumType::values((EnumType *)0x13444d2);
    std::ranges::
    subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_(std::ranges::subrange_kind)0>
    ::begin(&local_48);
    std::ranges::
    subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_(std::ranges::subrange_kind)0>
    ::end(&local_48);
    bVar1 = operator==<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>_>
                      ((self_type *)in_RDI,in_stack_ffffffffffffff48);
    if (bVar1) {
      slang::ConstantValue::ConstantValue((ConstantValue *)in_RDI,in_stack_ffffffffffffff48);
    }
    else {
      if ((*(byte *)(in_RSI + 0x38) & 1) == 0) {
        std::ranges::
        subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_(std::ranges::subrange_kind)0>
        ::begin(&local_48);
        do {
          iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_false>
          ::operator++<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>_>
                    ((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_false>
                      *)this_00,(int)((ulong)in_RDI >> 0x20));
          std::ranges::
          subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_(std::ranges::subrange_kind)0>
          ::end(&local_48);
          bVar1 = operator==<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>_>
                            ((self_type *)in_RDI,in_stack_ffffffffffffff48);
        } while (!bVar1);
        local_60 = iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_false>
                   ::operator*((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_false>
                                *)0x134459b);
      }
      else {
        std::ranges::
        subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_(std::ranges::subrange_kind)0>
        ::begin(&local_48);
        local_60 = iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_false>
                   ::operator*((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_false>
                                *)0x1344546);
      }
      SourceRange::SourceRange((SourceRange *)in_RDI);
      referencingRange.endLoc = (SourceLocation)args;
      referencingRange.startLoc = (SourceLocation)type;
      EnumValueSymbol::getValue((EnumValueSymbol *)range._M_end.current,referencingRange);
      slang::ConstantValue::ConstantValue((ConstantValue *)in_RDI,(ConstantValue *)local_60);
    }
  }
  else {
    slang::ConstantValue::ConstantValue((ConstantValue *)in_RDI,in_stack_ffffffffffffff48);
  }
  return (ConstantValue *)this_00;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo&) const final {
        if (!noHierarchical(context, *args[0]))
            return nullptr;

        // Expression isn't actually evaluated here; we know the value to return at compile time.
        const EnumType& type = args[0]->type->getCanonicalType().as<EnumType>();

        auto range = type.values();
        if (range.begin() == range.end())
            return nullptr;

        const EnumValueSymbol* value;
        if (first) {
            value = &*range.begin();
        }
        else {
            for (auto it = range.begin();;) {
                auto prev = it++;
                if (it == range.end()) {
                    value = &*prev;
                    break;
                }
            }
        }

        return value->getValue();
    }